

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

void GetShellEscapedString(string *input,string *result)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  char kEscapeSequence [4];
  
  if (result == (string *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util.cc",
                  0x115,"void GetShellEscapedString(const string &, string *)");
  }
  uVar2 = input->_M_string_length;
  bVar7 = uVar2 != 0;
  if (bVar7) {
    bVar7 = true;
    uVar5 = 1;
    do {
      bVar1 = (input->_M_dataplus)._M_p[uVar5 - 1];
      if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
         ((0x34 < bVar1 - 0x2b || ((0x1000000000001dU >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) == 0)))
         ) break;
      bVar7 = uVar5 < uVar2;
      bVar8 = uVar5 != uVar2;
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  if (bVar7) {
    std::__cxx11::string::push_back((char)result);
    pcVar4 = (input->_M_dataplus)._M_p;
    pcVar3 = pcVar4;
    for (sVar6 = input->_M_string_length; sVar6 != 0; sVar6 = sVar6 - 1) {
      if (*pcVar4 == '\'') {
        std::__cxx11::string::replace
                  ((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar3);
        std::__cxx11::string::append((char *)result);
        pcVar3 = pcVar4;
      }
      pcVar4 = pcVar4 + 1;
    }
    std::__cxx11::string::replace((ulong)result,result->_M_string_length,(char *)0x0,(ulong)pcVar3);
    std::__cxx11::string::push_back((char)result);
    return;
  }
  std::__cxx11::string::_M_append((char *)result,(ulong)(input->_M_dataplus)._M_p);
  return;
}

Assistant:

void GetShellEscapedString(const string& input, string* result) {
  assert(result);

  if (!StringNeedsShellEscaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '\'';
  const char kEscapeSequence[] = "'\\'";

  result->push_back(kQuote);

  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    if (*it == kQuote) {
      result->append(span_begin, it);
      result->append(kEscapeSequence);
      span_begin = it;
    }
  }
  result->append(span_begin, input.end());
  result->push_back(kQuote);
}